

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

int __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::remove(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
         *this,char *__filename)

{
  in_fake_critical_section<std::byte> *piVar1;
  in_fake_critical_section<std::byte> *piVar2;
  int extraout_EAX;
  key_union *pkVar3;
  byte bVar4;
  key_union *pkVar5;
  key_union *pkVar6;
  ulong uVar7;
  key_union *pkVar8;
  undefined1 local_20 [8];
  leaf_reclaimable_ptr r;
  
  bVar4 = this->field_0x8;
  uVar7 = (ulong)bVar4;
  if (bVar4 <= (byte)__filename) {
    __assert_fail("child_index < children_count_",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x586,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  pkVar3 = &this->keys;
  pkVar6 = (key_union *)((long)(this->children)._M_elems + (uVar7 - 4));
  pkVar5 = pkVar3;
  do {
    uVar7 = uVar7 - 1;
    pkVar8 = pkVar6;
    if (uVar7 == 0) break;
    pkVar8 = (key_union *)((long)pkVar5 + 1);
    piVar1 = (pkVar5->byte_array)._M_elems;
    piVar2 = (pkVar5->byte_array)._M_elems;
    pkVar5 = pkVar8;
  } while (piVar2->value <= piVar1[1].value);
  if (pkVar8 != pkVar6) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x588,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  uVar7 = (ulong)__filename & 0xff;
  r._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  ._M_head_impl.db =
       (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        )((this->children)._M_elems[uVar7].value.tagged_ptr & 0xfffffffffffffff8);
  if (uVar7 < bVar4 - 1) {
    do {
      *(undefined1 *)((long)pkVar3 + uVar7) =
           *(undefined1 *)((long)(this->children)._M_elems + (uVar7 - 3));
      (this->children)._M_elems[uVar7].value.tagged_ptr =
           (this->children)._M_elems[uVar7 + 1].value.tagged_ptr;
      uVar7 = uVar7 + 1;
    } while (bVar4 - 1 != uVar7);
  }
  bVar4 = bVar4 - 1;
  this->field_0x8 = bVar4;
  uVar7 = (ulong)bVar4;
  pkVar6 = (key_union *)((long)(this->children)._M_elems + (uVar7 - 4));
  pkVar5 = pkVar6;
  if (bVar4 != 0) {
    do {
      uVar7 = uVar7 - 1;
      pkVar5 = pkVar6;
      if (uVar7 == 0) break;
      pkVar5 = (key_union *)((long)pkVar3 + 1);
      piVar1 = (pkVar3->byte_array)._M_elems;
      piVar2 = (pkVar3->byte_array)._M_elems;
      pkVar3 = pkVar5;
    } while (piVar2->value <= piVar1[1].value);
  }
  if (pkVar5 != pkVar6) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x59a,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  std::
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_20);
  return extraout_EAX;
}

Assistant:

constexpr void remove(std::uint8_t child_index,
                        db_type &db_instance) noexcept {
    auto children_count_ = this->children_count.load();

    UNODB_DETAIL_ASSERT(child_index < children_count_);
    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));

    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        children[child_index].load().template ptr<leaf_type *>(), db_instance)};

    typename decltype(keys.byte_array)::size_type i = child_index;
    for (; i < static_cast<unsigned>(children_count_ - 1); ++i) {
      keys.byte_array[i] = keys.byte_array[i + 1];
      children[i] = children[i + 1];
    }
#ifndef UNODB_DETAIL_X86_64
    keys.byte_array[i] = unused_key_byte;
#endif

    --children_count_;
    this->children_count = children_count_;

    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));
  }